

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O3

void __thiscall imrt::Plan::newCopy(Plan *this,Plan *p)

{
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *plVar1;
  size_t *psVar2;
  Station *this_00;
  _List_node_base *p_Var3;
  mapped_type *ppSVar4;
  _List_node_base *p_Var5;
  int local_34;
  
  this->last_changed = (Station *)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&this->w,&p->w);
  std::vector<double,_std::allocator<double>_>::operator=(&this->Zmin,&p->Zmin);
  std::vector<double,_std::allocator<double>_>::operator=(&this->Zmax,&p->Zmax);
  plVar1 = &this->stations;
  p_Var5 = (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)plVar1) {
    p_Var3 = p_Var5->_M_next;
    operator_delete(p_Var5);
    p_Var5 = p_Var3;
  }
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node._M_size = 0;
  p_Var5 = (p->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var5 != (_List_node_base *)&p->stations) {
    do {
      this_00 = (Station *)operator_new(0x170);
      Station::Station(this_00,(Station *)p_Var5[1]._M_next);
      if ((p->last_changed != (Station *)0x0) && (p->last_changed->angle == this_00->angle)) {
        this->last_changed = this_00;
      }
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = (_List_node_base *)this_00;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar2 = &(this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
      local_34 = this_00->angle;
      ppSVar4 = std::
                map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                ::operator[](&this->angle2station,&local_34);
      *ppSVar4 = this_00;
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != (_List_node_base *)&p->stations);
  }
  this->evaluation_fx = p->evaluation_fx;
  return;
}

Assistant:

void Plan::newCopy(Plan& p) {
    last_changed=NULL;
    //ev= EvaluationFunction::getInstance();

    w=p.w;
    Zmin=p.Zmin;
    Zmax=p.Zmax;
    stations.clear();
    //real_stations.clear();
    for (list<Station*>::const_iterator it=p.stations.begin();it!=p.stations.end();it++) {
      Station* aux = new Station (**it);
      if (p.last_changed!=NULL && p.last_changed->getAngle()==aux->getAngle()) last_changed=aux;
      stations.push_back(aux);
      angle2station[aux->getAngle()]=aux;
      //real_stations.push_back(*aux);
    }
    evaluation_fx=p.evaluation_fx;
  }